

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O0

void __thiscall
Refal2::CArbitraryInteger::subFromBigger(CArbitraryInteger *this,CArbitraryInteger *operand)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  unsigned_long *puVar4;
  reference puVar5;
  reference puVar6;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_68;
  uint local_5c;
  iterator iStack_58;
  TDigit sub;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_50;
  bool local_41;
  const_iterator cStack_40;
  bool take;
  const_iterator j;
  iterator i;
  size_type local_28;
  size_type local_20;
  CArbitraryInteger *local_18;
  CArbitraryInteger *operand_local;
  CArbitraryInteger *this_local;
  
  local_18 = operand;
  operand_local = this;
  local_20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
  local_28 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       (&local_18->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
  puVar4 = std::max<unsigned_long>(&local_20,&local_28);
  i._M_current._4_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,*puVar4,
             (value_type *)((long)&i._M_current + 4));
  j._M_current = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                   (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>
                                   );
  cStack_40 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cbegin
                        (&local_18->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
  local_41 = false;
  while( true ) {
    local_50._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cend
                           (&local_18->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
    bVar2 = __gnu_cxx::operator!=(&stack0xffffffffffffffc0,&local_50);
    if (!bVar2) {
      while( true ) {
        if ((local_41 & 1U) == 0) {
          return;
        }
        local_68._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)&j,&local_68);
        if (!bVar2) break;
        puVar6 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              *)&j);
        if (*puVar6 != 0) {
          puVar6 = __gnu_cxx::
                   __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator*((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)&j);
          *puVar6 = *puVar6 - 1;
          local_41 = false;
        }
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)&j);
      }
      __assert_fail("i != end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/ArbitraryInteger.cpp"
                    ,0x162,
                    "void Refal2::CArbitraryInteger::subFromBigger(const CArbitraryInteger &)");
    }
    iStack_58 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                          (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)&j,&stack0xffffffffffffffa8);
    if (!bVar2) break;
    puVar5 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&stack0xffffffffffffffc0);
    local_5c = *puVar5 + (uint)((local_41 & 1U) != 0);
    puVar6 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&j);
    uVar1 = local_5c;
    bVar2 = local_5c <= *puVar6;
    if (bVar2) {
      puVar6 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)&j);
      *puVar6 = *puVar6 - uVar1;
    }
    else {
      iVar3 = 0x1000000 - local_5c;
      puVar6 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)&j);
      *puVar6 = iVar3 + *puVar6;
    }
    local_41 = !bVar2;
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&stack0xffffffffffffffc0);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                *)&j);
  }
  __assert_fail("i != end()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/ArbitraryInteger.cpp"
                ,0x155,"void Refal2::CArbitraryInteger::subFromBigger(const CArbitraryInteger &)");
}

Assistant:

void CArbitraryInteger::subFromBigger( const CArbitraryInteger& operand )
{
	resize( std::max( size(), operand.size() ), 0 );
	iterator i = begin();
	const_iterator j = operand.cbegin();
	bool take = false;
	while( j != operand.cend() ) {
		assert( i != end() );
		TDigit sub = *j + ( take ? 1 : 0 );
		if( *i < sub ) {
			*i += Base - sub;
			take = true;
		} else {
			*i -= sub;
			take = false;
		}
		++j;
		++i;
	}
	while( take ) {
		assert( i != end() );
		if( *i > 0 ) {
			( *i )--;
			take = false;
		}
		++i;
	}
}